

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall CFFFileInput::ReadEncodings(CFFFileInput *this)

{
  bool bVar1;
  EStatusCode EVar2;
  EncodingsInfo *this_00;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_>,_bool> pVar4;
  pair<const_long_long,_EncodingsInfo_*> local_b0;
  _Base_ptr local_a0;
  undefined1 local_98;
  EncodingsInfo *local_90;
  EncodingsInfo *encoding;
  _Base_ptr local_80;
  LongFilePositionType local_68;
  LongFilePositionType encodingPosition;
  unsigned_long i;
  iterator it;
  LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
  EStatusCode status;
  CFFFileInput *this_local;
  
  std::
  map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  ::map((map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
         *)&it);
  std::_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_> *)&i);
  for (encodingPosition = 0; (ulong)encodingPosition < (ulong)this->mFontsCount;
      encodingPosition = encodingPosition + 1) {
    local_68 = GetEncodingPosition(this,(unsigned_short)encodingPosition);
    local_80 = (_Base_ptr)
               std::
               map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
               ::find((map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
                       *)&it,&local_68);
    i = (unsigned_long)local_80;
    encoding = (EncodingsInfo *)
               std::
               map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
               ::end((map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
                      *)&it);
    bVar1 = std::operator==((_Self *)&i,(_Self *)&encoding);
    if (bVar1) {
      this_00 = (EncodingsInfo *)operator_new(0x50);
      EncodingsInfo::EncodingsInfo(this_00);
      local_90 = this_00;
      ReadEncoding(this,this_00,local_68);
      std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::push_back
                (&this->mEncodings,&local_90);
      std::pair<const_long_long,_EncodingsInfo_*>::pair<long_long_&,_EncodingsInfo_*&,_true>
                (&local_b0,&local_68,&local_90);
      pVar4 = std::
              map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
              ::insert((map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
                        *)&it,&local_b0);
      local_a0 = (_Base_ptr)pVar4.first._M_node;
      local_98 = pVar4.second;
      i = (unsigned_long)local_a0;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_> *)&i);
    this->mTopDictIndex[encodingPosition].mEncoding = ppVar3->second;
  }
  EVar2 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  std::
  map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  ::~map((map<long_long,_EncodingsInfo_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
          *)&it);
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadEncodings()
{
	// read all encodings positions
	EStatusCode status = PDFHummus::eSuccess;
	LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
	LongFilePositionTypeToEncodingsInfoMap::iterator it;

	for(unsigned long i=0; i < mFontsCount && (PDFHummus::eSuccess == status); ++i)
	{
		LongFilePositionType encodingPosition = GetEncodingPosition(i);
		it = offsetToEncoding.find(encodingPosition);
		if(it == offsetToEncoding.end())
		{
			EncodingsInfo* encoding = new EncodingsInfo();
			ReadEncoding(encoding,encodingPosition);
			mEncodings.push_back(encoding);
			it = offsetToEncoding.insert(LongFilePositionTypeToEncodingsInfoMap::value_type(encodingPosition,encoding)).first;
		}
		mTopDictIndex[i].mEncoding = it->second;
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();

}